

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

IndirOpnd * __thiscall
Lowerer::GenerateFastElemICommon
          (Lowerer *this,Instr *elemInstr,bool isStore,IndirOpnd *indirOpnd,LabelInstr *labelHelper,
          LabelInstr *labelCantUseArray,LabelInstr *labelFallthrough,bool *pIsTypedArrayElement,
          bool *pIsStringIndex,bool *emitBailoutRef,Opnd **maskOpnd,
          LabelInstr **pLabelSegmentLengthIncreased,bool checkArrayLengthOverflow,
          bool forceGenerateFastPath,bool returnLength,LabelInstr *bailOutLabelInstr,
          bool *indirOpndOverflowed,FldInfoFlags flags)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  IndirOpnd *pIVar4;
  bool local_a1;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_8a;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_88;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_86;
  bool local_83;
  byte local_82;
  byte local_81;
  bool generateFastpath;
  bool normalSlots;
  RegOpnd *pRStack_80;
  bool normalLocation;
  RegOpnd *indexOpnd;
  RegOpnd *baseOpnd;
  bool returnLength_local;
  bool forceGenerateFastPath_local;
  LabelInstr *pLStack_68;
  bool checkArrayLengthOverflow_local;
  LabelInstr *labelCantUseArray_local;
  LabelInstr *labelHelper_local;
  IndirOpnd *indirOpnd_local;
  Instr *pIStack_48;
  bool isStore_local;
  Instr *elemInstr_local;
  Lowerer *this_local;
  
  baseOpnd._7_1_ = checkArrayLengthOverflow;
  baseOpnd._6_1_ = forceGenerateFastPath;
  baseOpnd._5_1_ = returnLength;
  *pIsTypedArrayElement = false;
  *pIsStringIndex = false;
  if (pLabelSegmentLengthIncreased != (LabelInstr **)0x0) {
    *pLabelSegmentLengthIncreased = (LabelInstr *)0x0;
  }
  if (maskOpnd != (Opnd **)0x0) {
    *maskOpnd = (Opnd *)0x0;
  }
  if (indirOpndOverflowed != (bool *)0x0) {
    *indirOpndOverflowed = false;
  }
  if (emitBailoutRef != (bool *)0x0) {
    *emitBailoutRef = false;
  }
  pLStack_68 = labelCantUseArray;
  labelCantUseArray_local = labelHelper;
  labelHelper_local = (LabelInstr *)indirOpnd;
  indirOpnd_local._7_1_ = isStore;
  pIStack_48 = elemInstr;
  elemInstr_local = (Instr *)this;
  indexOpnd = IR::IndirOpnd::GetBaseOpnd(indirOpnd);
  if (indexOpnd == (RegOpnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3ff7,"(baseOpnd)","This shouldn\'t be NULL");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = IR::Opnd::IsTaggedInt(&indexOpnd->super_Opnd);
  if (!bVar2) {
    pRStack_80 = IR::IndirOpnd::GetIndexOpnd((IndirOpnd *)labelHelper_local);
    if (pRStack_80 != (RegOpnd *)0x0) {
      local_81 = (flags & (FldInfo_FromLocalWithoutProperty|FldInfo_FromProto|FldInfo_FromLocal)) !=
                 FldInfo_NoInfo;
      local_82 = (flags & (FldInfo_FromAuxSlots|FldInfo_FromInlineSlots)) != FldInfo_NoInfo;
      local_86.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           IR::Opnd::GetValueType(&indexOpnd->super_Opnd);
      bVar2 = ValueType::IsLikelyOptimizedTypedArray((ValueType *)&local_86.field_0);
      local_a1 = false;
      if (((!bVar2) && (local_a1 = false, (local_81 & 1) != 0)) &&
         (local_a1 = false, (local_82 & 1) != 0)) {
        local_a1 = flags != FldInfo_NoInfo;
      }
      local_83 = local_a1;
      local_88.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           IR::Opnd::GetValueType(&pRStack_80->super_Opnd);
      bVar2 = ValueType::IsLikelyString((ValueType *)&local_88.field_0);
      if (bVar2) {
        if ((local_83 & 1U) != 0) {
          *pIsTypedArrayElement = false;
          *pIsStringIndex = true;
          pIVar4 = GenerateFastElemIStringIndexCommon
                             (this,pIStack_48,(bool)(indirOpnd_local._7_1_ & 1),
                              (IndirOpnd *)labelHelper_local,labelCantUseArray_local,flags);
          return pIVar4;
        }
        return (IndirOpnd *)0x0;
      }
      local_8a.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           IR::Opnd::GetValueType(&pRStack_80->super_Opnd);
      bVar2 = ValueType::IsLikelySymbol((ValueType *)&local_8a.field_0);
      if (bVar2) {
        if ((local_83 & 1U) != 0) {
          pIVar4 = GenerateFastElemISymbolIndexCommon
                             (this,pIStack_48,(bool)(indirOpnd_local._7_1_ & 1),
                              (IndirOpnd *)labelHelper_local,labelCantUseArray_local,flags);
          return pIVar4;
        }
        return (IndirOpnd *)0x0;
      }
    }
    pIVar4 = GenerateFastElemIIntIndexCommon
                       (this,pIStack_48,(bool)(indirOpnd_local._7_1_ & 1),
                        (IndirOpnd *)labelHelper_local,labelCantUseArray_local,pLStack_68,
                        labelFallthrough,pIsTypedArrayElement,emitBailoutRef,
                        pLabelSegmentLengthIncreased,(bool)(baseOpnd._7_1_ & 1),maskOpnd,false,
                        (bool)(baseOpnd._5_1_ & 1),bailOutLabelInstr,indirOpndOverflowed);
    return pIVar4;
  }
  return (IndirOpnd *)0x0;
}

Assistant:

IR::IndirOpnd*
Lowerer::GenerateFastElemICommon(
    _In_ IR::Instr* elemInstr,
    _In_ bool isStore,
    _In_ IR::IndirOpnd* indirOpnd,
    _In_ IR::LabelInstr* labelHelper,
    _In_ IR::LabelInstr* labelCantUseArray,
    _In_opt_ IR::LabelInstr* labelFallthrough,
    _Out_ bool* pIsTypedArrayElement,
    _Out_ bool* pIsStringIndex,
    _Out_opt_ bool* emitBailoutRef,
    _Outptr_opt_result_maybenull_ IR::Opnd** maskOpnd,
    _Outptr_opt_result_maybenull_ IR::LabelInstr** pLabelSegmentLengthIncreased, // = nullptr
    _In_ bool checkArrayLengthOverflow, //  = true
    _In_ bool forceGenerateFastPath, // = false
    _In_ bool returnLength, // = false
    _In_opt_ IR::LabelInstr* bailOutLabelInstr, // = nullptr
    _Out_opt_ bool* indirOpndOverflowed, // = nullptr
    _In_ Js::FldInfoFlags flags) // = Js::FldInfo_NoInfo
{
    *pIsTypedArrayElement = false;
    *pIsStringIndex = false;
    if(pLabelSegmentLengthIncreased)
    {
        *pLabelSegmentLengthIncreased = nullptr;
    }
    if (maskOpnd)
    {
        *maskOpnd = nullptr;
    }
    if (indirOpndOverflowed)
    {
        *indirOpndOverflowed = false;
    }
    if (emitBailoutRef)
    {
        *emitBailoutRef = false;
    }
    IR::RegOpnd *baseOpnd = indirOpnd->GetBaseOpnd();
    AssertMsg(baseOpnd, "This shouldn't be NULL");

    // Caution: If making changes to the conditions under which we don't emit the typical array checks, make sure
    // the code in GlobOpt::ShouldAssumeIndirOpndHasNonNegativeIntIndex is updated accordingly.  We don't want the
    // global optimizer to type specialize instructions, for which the lowerer is forced to emit unconditional
    // bailouts.
    if (baseOpnd->IsTaggedInt())
    {
        return NULL;
    }

    IR::RegOpnd *indexOpnd = indirOpnd->GetIndexOpnd();
    if (indexOpnd)
    {
        const bool normalLocation = (flags & (Js::FldInfo_FromLocal | Js::FldInfo_FromProto | Js::FldInfo_FromLocalWithoutProperty)) != 0;
        const bool normalSlots = (flags & (Js::FldInfo_FromAuxSlots | Js::FldInfo_FromInlineSlots)) != 0;
        const bool generateFastpath = !baseOpnd->GetValueType().IsLikelyOptimizedTypedArray() && normalLocation && normalSlots && flags != Js::FldInfo_NoInfo;
        if (indexOpnd->GetValueType().IsLikelyString())
        {
            if (generateFastpath)
            {
                // If profile data says that it's a typed array - do not generate the property string fast path as the src. could be a temp and that would cause a bug.
                *pIsTypedArrayElement = false;
                *pIsStringIndex = true;
                return GenerateFastElemIStringIndexCommon(elemInstr, isStore, indirOpnd, labelHelper, flags);
            }
            else
            {
                // There's no point in generating the int index fast path if we know the index has a string value.
                return nullptr;
            }
        }
        else if (indexOpnd->GetValueType().IsLikelySymbol())
        {
            if (generateFastpath)
            {
                // If profile data says that it's a typed array - do not generate the symbol fast path as the src. could be a temp and that would cause a bug.
                return GenerateFastElemISymbolIndexCommon(elemInstr, isStore, indirOpnd, labelHelper, flags);
            }
            else
            {
                // There's no point in generating the int index fast path if we know the index has a symbol value.
                return nullptr;
            }
        }
    }
    return
        GenerateFastElemIIntIndexCommon(
            elemInstr,
            isStore,
            indirOpnd,
            labelHelper,
            labelCantUseArray,
            labelFallthrough,
            pIsTypedArrayElement,
            emitBailoutRef,
            pLabelSegmentLengthIncreased,
            checkArrayLengthOverflow,
            maskOpnd,
            false,
            returnLength,
            bailOutLabelInstr,
            indirOpndOverflowed);
}